

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

VkResult __thiscall
myvk::CommandBuffer::Submit
          (CommandBuffer *this,SemaphoreStageGroup *wait_semaphores,
          SemaphoreGroup *signal_semaphores,Ptr<Fence> *fence)

{
  PFN_vkQueueSubmit p_Var1;
  bool bVar2;
  uint32_t uVar3;
  VkResult VVar4;
  element_type *peVar5;
  VkQueue pVVar6;
  element_type *this_00;
  __shared_ptr *in_RCX;
  long in_RDI;
  lock_guard<std::mutex> lock_guard;
  VkSubmitInfo info;
  mutex_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  VkFence local_b8;
  VkSubmitInfo local_68;
  __shared_ptr *local_20;
  
  local_20 = in_RCX;
  memset(&local_68,0,0x48);
  local_68.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_68.commandBufferCount = 1;
  local_68.pCommandBuffers = (VkCommandBuffer *)(in_RDI + 0x28);
  uVar3 = SemaphoreStageGroup::GetCount((SemaphoreStageGroup *)0x2abaf6);
  if (uVar3 != 0) {
    local_68.waitSemaphoreCount = SemaphoreStageGroup::GetCount((SemaphoreStageGroup *)0x2abb08);
    local_68.pWaitSemaphores =
         SemaphoreStageGroup::GetSemaphoresPtr((SemaphoreStageGroup *)0x2abb19);
    local_68.pWaitDstStageMask =
         SemaphoreStageGroup::GetWaitStagesPtr((SemaphoreStageGroup *)0x2abb2b);
  }
  uVar3 = SemaphoreGroup::GetCount((SemaphoreGroup *)0x2abb40);
  if (uVar3 != 0) {
    local_68.signalSemaphoreCount = SemaphoreGroup::GetCount((SemaphoreGroup *)0x2abb52);
    local_68.pSignalSemaphores = SemaphoreGroup::GetSemaphoresPtr((SemaphoreGroup *)0x2abb66);
  }
  peVar5 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2abb81);
  CommandPool::GetQueuePtr(peVar5);
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2abb91)
  ;
  Queue::GetMutex((Queue *)0x2abb99);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
             ,in_stack_ffffffffffffff38);
  p_Var1 = vkQueueSubmit;
  peVar5 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2abbbf);
  CommandPool::GetQueuePtr(peVar5);
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2abbd8)
  ;
  pVVar6 = Queue::GetHandle((Queue *)0x2abbe0);
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar2) {
    this_00 = std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2abc07);
    local_b8 = Fence::GetHandle(this_00);
  }
  else {
    local_b8 = (VkFence)0x0;
  }
  VVar4 = (*p_Var1)(pVVar6,1,&local_68,local_b8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2abc56);
  return VVar4;
}

Assistant:

VkResult CommandBuffer::Submit(const SemaphoreStageGroup &wait_semaphores, const SemaphoreGroup &signal_semaphores,
                               const Ptr<Fence> &fence) const {
	VkSubmitInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;

	info.commandBufferCount = 1;
	info.pCommandBuffers = &m_command_buffer;

	if (wait_semaphores.GetCount()) {
		info.waitSemaphoreCount = wait_semaphores.GetCount();
		info.pWaitSemaphores = wait_semaphores.GetSemaphoresPtr();
		info.pWaitDstStageMask = wait_semaphores.GetWaitStagesPtr();
	}

	if (signal_semaphores.GetCount()) {
		info.signalSemaphoreCount = signal_semaphores.GetCount();
		info.pSignalSemaphores = signal_semaphores.GetSemaphoresPtr();
	}

	std::lock_guard<std::mutex> lock_guard{m_command_pool_ptr->GetQueuePtr()->GetMutex()};
	return vkQueueSubmit(m_command_pool_ptr->GetQueuePtr()->GetHandle(), 1, &info,
	                     fence ? fence->GetHandle() : VK_NULL_HANDLE);
}